

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase85::run(TestCase85 *this)

{
  Builder reader;
  Reader reader_00;
  Reader reader_01;
  bool bVar1;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_217;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  Builder root;
  Builder local_1a0;
  Reader local_178;
  Reader local_148;
  uint local_114 [3];
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  __kjCondition = (SegmentReader *)0x220000000c;
  value.size_ = 3;
  value.ptr = (uint *)&_kjCondition;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&root,value);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List(&root);
  _kjCondition.value = bVar1;
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
               (char (*) [38])"failed: expected root.hasUInt32List()",&_kjCondition);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List(&orphan,&root);
  __kjCondition = (SegmentReader *)CONCAT71(uStack_217,orphan.builder.location != (word *)0x0);
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",&_kjCondition);
  }
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&local_148,&orphan.builder);
  __kjCondition = (SegmentReader *)0x220000000c;
  reader_00.reader.capTable = local_148.reader.capTable;
  reader_00.reader.segment = local_148.reader.segment;
  reader_00.reader.ptr = local_148.reader.ptr;
  reader_00.reader.elementCount = local_148.reader.elementCount;
  reader_00.reader.step = local_148.reader.step;
  reader_00.reader.structDataSize = local_148.reader.structDataSize;
  reader_00.reader.structPointerCount = local_148.reader.structPointerCount;
  reader_00.reader.elementSize = local_148.reader.elementSize;
  reader_00.reader._39_1_ = local_148.reader._39_1_;
  reader_00.reader.nestingLimit = local_148.reader.nestingLimit;
  reader_00.reader._44_4_ = local_148.reader._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&_kjCondition;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_00,expected);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            (&local_1a0,&orphan.builder);
  __kjCondition = (SegmentReader *)0x220000000c;
  reader.builder.capTable = local_1a0.builder.capTable;
  reader.builder.segment = local_1a0.builder.segment;
  reader.builder.ptr = local_1a0.builder.ptr;
  reader.builder.elementCount = local_1a0.builder.elementCount;
  reader.builder.step = local_1a0.builder.step;
  reader.builder.structDataSize = local_1a0.builder.structDataSize;
  reader.builder.structPointerCount = local_1a0.builder.structPointerCount;
  reader.builder.elementSize = local_1a0.builder.elementSize;
  reader.builder._39_1_ = local_1a0.builder._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&_kjCondition;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader,expected_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List(&root);
  __kjCondition = (SegmentReader *)CONCAT71(uStack_217,!bVar1);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"!(root.hasUInt32List())\", _kjCondition",
               (char (*) [41])"failed: expected !(root.hasUInt32List())",&_kjCondition);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List(&root,&orphan);
  __kjCondition = (SegmentReader *)&orphan;
  if ((orphan.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,100,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List(&root);
  __kjCondition = (SegmentReader *)CONCAT71(uStack_217,bVar1);
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x65,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
               (char (*) [38])"failed: expected root.hasUInt32List()",&_kjCondition);
  }
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            (&local_178,(Reader *)&_kjCondition);
  local_114[0] = 0xc;
  local_114[1] = 0x22;
  local_114[2] = 0x38;
  reader_01.reader.capTable = local_178.reader.capTable;
  reader_01.reader.segment = local_178.reader.segment;
  reader_01.reader.ptr = local_178.reader.ptr;
  reader_01.reader.elementCount = local_178.reader.elementCount;
  reader_01.reader.step = local_178.reader.step;
  reader_01.reader.structDataSize = local_178.reader.structDataSize;
  reader_01.reader.structPointerCount = local_178.reader.structPointerCount;
  reader_01.reader.elementSize = local_178.reader.elementSize;
  reader_01.reader._39_1_ = local_178.reader._39_1_;
  reader_01.reader.nestingLimit = local_178.reader.nestingLimit;
  reader_01.reader._44_4_ = local_178.reader._44_4_;
  expected_01._M_len = 3;
  expected_01._M_array = local_114;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_01,expected_01);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, Lists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setUInt32List({12, 34, 56});
  EXPECT_TRUE(root.hasUInt32List());

  Orphan<List<uint32_t>> orphan = root.disownUInt32List();
  EXPECT_FALSE(orphan == nullptr);

  checkList(orphan.getReader(), {12u, 34u, 56u});
  checkList(orphan.get(), {12u, 34u, 56u});
  EXPECT_FALSE(root.hasUInt32List());

  root.adoptUInt32List(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasUInt32List());
  checkList(root.asReader().getUInt32List(), {12u, 34u, 56u});
}